

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void ERR_restore_state(ERR_SAVE_STATE *state)

{
  ERR_STATE *pEVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  if ((state != (ERR_SAVE_STATE *)0x0) && (state->num_errors != 0)) {
    if (state->num_errors < 0x10) {
      pEVar1 = err_get_state();
      if (pEVar1 != (ERR_STATE *)0x0) {
        lVar3 = 0;
        for (uVar2 = 0; uVar2 < state->num_errors; uVar2 = uVar2 + 1) {
          err_copy((err_error_st *)((long)&pEVar1->errors[0].file + lVar3),
                   (err_error_st *)((long)&state->errors->file + lVar3));
          lVar3 = lVar3 + 0x18;
        }
        pEVar1->top = (int)state->num_errors - 1;
        pEVar1->bottom = 0xf;
      }
      return;
    }
    abort();
  }
  ERR_clear_error();
  return;
}

Assistant:

void ERR_restore_state(const ERR_SAVE_STATE *state) {
  if (state == NULL || state->num_errors == 0) {
    ERR_clear_error();
    return;
  }

  if (state->num_errors >= ERR_NUM_ERRORS) {
    abort();
  }

  ERR_STATE *const dst = err_get_state();
  if (dst == NULL) {
    return;
  }

  for (size_t i = 0; i < state->num_errors; i++) {
    err_copy(&dst->errors[i], &state->errors[i]);
  }
  dst->top = (unsigned)(state->num_errors - 1);
  dst->bottom = ERR_NUM_ERRORS - 1;
}